

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyv_multicases(lyd_node *node,lys_node *schemanode,lyd_node **first_sibling,int autodelete,
                  lyd_node *nodel)

{
  lyd_node *plVar1;
  lys_node *node_00;
  lys_node *plVar2;
  lys_node *node_01;
  lyd_node *node_02;
  
  if (node == (lyd_node *)0x0 && schemanode == (lys_node *)0x0) {
    __assert_fail("node || schemanode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                  ,0xd11,
                  "int lyv_multicases(struct lyd_node *, struct lys_node *, struct lyd_node **, int, struct lyd_node *)"
                 );
  }
  if (schemanode == (lys_node *)0x0) {
    schemanode = node->schema;
  }
  node_00 = lys_parent(schemanode);
  if ((((node_00 != (lys_node *)0x0) && (first_sibling != (lyd_node **)0x0)) &&
      ((node_00->nodetype & (LYS_CASE|LYS_CHOICE)) != LYS_UNKNOWN)) &&
     (*first_sibling != (lyd_node *)0x0)) {
    node_01 = schemanode;
    if (node_00->nodetype != LYS_CHOICE) {
      plVar2 = lys_parent(node_00);
      node_01 = node_00;
      node_00 = plVar2;
    }
    node_02 = *first_sibling;
    while (node_02 != (lyd_node *)0x0) {
      do {
        plVar1 = node_02->next;
        if (((schemanode != node_02->schema) &&
            (plVar2 = lys_parent(node_02->schema), plVar2 != (lys_node *)0x0)) &&
           (((plVar2->nodetype == LYS_CHOICE && (plVar2 == node_00)) ||
            ((plVar2 != node_01 && plVar2->nodetype == LYS_CASE &&
             (plVar2 = lys_parent(plVar2), plVar2 == node_00)))))) {
          if (autodelete == 0) {
            ly_vlog(LYE_MCASEDATA,(uint)(node != (lyd_node *)0x0) * 3,node,node_00->name);
            return 1;
          }
          if (node_02 == nodel) {
            ly_vlog(LYE_MCASEDATA,LY_VLOG_LYD,node_02,node_00->name);
            return 2;
          }
          if (node_02 == *first_sibling) {
            *first_sibling = plVar1;
          }
          lyd_free(node_02);
        }
        node_02 = plVar1;
      } while (plVar1 != (lyd_node *)0x0);
      if (*first_sibling == (lyd_node *)0x0) {
        return 0;
      }
      node_01 = lys_parent(node_00);
      if (node_01 == (lys_node *)0x0) {
        return 0;
      }
      if ((node_01->nodetype & LYS_CASE) == LYS_UNKNOWN) {
        return 0;
      }
      node_00 = lys_parent(node_01);
      node_02 = *first_sibling;
    }
  }
  return 0;
}

Assistant:

int
lyv_multicases(struct lyd_node *node, struct lys_node *schemanode, struct lyd_node **first_sibling,
               int autodelete, struct lyd_node *nodel)
{
    struct lys_node *sparent, *schoice, *scase, *saux;
    struct lyd_node *next, *iter;
    assert(node || schemanode);

    if (!schemanode) {
        schemanode = node->schema;
    }

    sparent = lys_parent(schemanode);
    if (!sparent || !(sparent->nodetype & (LYS_CHOICE | LYS_CASE))) {
        /* node is not under any choice */
        return EXIT_SUCCESS;
    } else if (!first_sibling || !(*first_sibling)) {
        /* nothing to check */
        return EXIT_SUCCESS;
    }

    /* remember which case to skip in which choice */
    if (sparent->nodetype == LYS_CHOICE) {
        schoice = sparent;
        scase = schemanode;
    } else {
        schoice = lys_parent(sparent);
        scase = sparent;
    }

autodelete:
    /* remove all nodes from other cases than 'sparent' */
    LY_TREE_FOR_SAFE(*first_sibling, next, iter) {
        if (schemanode == iter->schema) {
            continue;
        }

        sparent = lys_parent(iter->schema);
        if (sparent && ((sparent->nodetype == LYS_CHOICE && sparent == schoice) /* another implicit case */
                || (sparent->nodetype == LYS_CASE && sparent != scase && lys_parent(sparent) == schoice)) /* another case */
                ) {
            if (autodelete) {
                if (iter == nodel) {
                    LOGVAL(LYE_MCASEDATA, LY_VLOG_LYD, iter, schoice->name);
                    return 2;
                }
                if (iter == *first_sibling) {
                    *first_sibling = next;
                }
                lyd_free(iter);
            } else {
                LOGVAL(LYE_MCASEDATA, node ? LY_VLOG_LYD : LY_VLOG_NONE, node, schoice->name);
                return 1;
            }
        }
    }

    if (*first_sibling && (saux = lys_parent(schoice)) && (saux->nodetype & LYS_CASE)) {
        /* go recursively in case of nested choices */
        schoice = lys_parent(saux);
        scase = saux;
        goto autodelete;
    }

    return EXIT_SUCCESS;
}